

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this,string *lang)

{
  char *pcVar1;
  iterator iVar2;
  _Alloc_hider __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  string dirVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirsVec;
  string libVar;
  allocator local_a9;
  string local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"CMAKE_",(allocator *)&local_88);
  std::__cxx11::string::append((string *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  pcVar1 = cmMakefile::GetDefinition(this->Makefile,&local_48);
  if (pcVar1 != (char *)0x0) {
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&local_88,pcVar1,(allocator *)&local_68);
    cmSystemTools::ExpandListArgument
              (&local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_a8,false);
    std::__cxx11::string::~string((string *)&local_88);
    for (__k._M_p = local_a8._M_dataplus._M_p; __k._M_p != (pointer)local_a8._M_string_length;
        __k._M_p = __k._M_p + 0x20) {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->ImplicitLinkLibs)._M_t,(key_type *)__k._M_p);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header) {
        AddItem(this,(string *)__k._M_p,(cmGeneratorTarget *)0x0);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
  }
  std::__cxx11::string::string((string *)&local_88,"CMAKE_",(allocator *)&local_a8);
  std::__cxx11::string::append((string *)&local_88);
  std::__cxx11::string::append((char *)&local_88);
  pcVar1 = cmMakefile::GetDefinition(this->Makefile,&local_88);
  if (pcVar1 != (char *)0x0) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
    cmSystemTools::ExpandListArgument(&local_a8,&local_68,false);
    std::__cxx11::string::~string((string *)&local_a8);
    cmOrderDirectories::AddLanguageDirectories(this->OrderLinkerSearchPath,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo(std::string const& lang)
{
  // Add libraries for this language that are not implied by the
  // linker language.
  std::string libVar = "CMAKE_";
  libVar += lang;
  libVar += "_IMPLICIT_LINK_LIBRARIES";
  if(const char* libs = this->Makefile->GetDefinition(libVar))
    {
    std::vector<std::string> libsVec;
    cmSystemTools::ExpandListArgument(libs, libsVec);
    for(std::vector<std::string>::const_iterator i = libsVec.begin();
        i != libsVec.end(); ++i)
      {
      if(this->ImplicitLinkLibs.find(*i) == this->ImplicitLinkLibs.end())
        {
        this->AddItem(*i, 0);
        }
      }
    }

  // Add linker search paths for this language that are not
  // implied by the linker language.
  std::string dirVar = "CMAKE_";
  dirVar += lang;
  dirVar += "_IMPLICIT_LINK_DIRECTORIES";
  if(const char* dirs = this->Makefile->GetDefinition(dirVar))
    {
    std::vector<std::string> dirsVec;
    cmSystemTools::ExpandListArgument(dirs, dirsVec);
    this->OrderLinkerSearchPath->AddLanguageDirectories(dirsVec);
    }
}